

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O3

int av1_cost_coeffs_txb_laplacian
              (MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,TXB_CTX *txb_ctx,
              int reduced_tx_set_used,int adjust_eob)

{
  TX_CLASS tx_class;
  char cVar1;
  ushort uVar2;
  int16_t *piVar3;
  tran_low_t *ptVar4;
  tran_low_t *ptVar5;
  tran_low_t *ptVar6;
  short *psVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  LV_MAP_COEFF_COST *txb_costs;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  int local_48 [2];
  TXB_CTX *local_40;
  ulong local_38;
  
  uVar2 = x->plane[plane].eobs[block];
  uVar18 = (uint)uVar2;
  local_38 = (ulong)tx_type;
  if (adjust_eob != 0) {
    piVar3 = av1_scan_orders[tx_size][tx_type].scan;
    lVar19 = (long)(block << 4);
    ptVar4 = x->plane[plane].coeff;
    ptVar5 = x->plane[plane].qcoeff;
    ptVar6 = x->plane[plane].dqcoeff;
    local_40 = txb_ctx;
    iVar9 = av1_get_tx_scale(tx_size);
    psVar7 = x->plane[plane].dequant_QTX;
    iVar14 = (int)*psVar7;
    iVar10 = (int)psVar7[1];
    local_48[0] = (iVar14 * 0x46 + 0x40 >> 7) + iVar14;
    local_48[1] = (iVar10 * 0x46 + 0x40 >> 7) + iVar10;
    if (uVar2 == 0) {
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      uVar17 = (ulong)uVar2;
      do {
        lVar15 = (long)piVar3[uVar17 - 1];
        uVar13 = ptVar4[lVar19 + lVar15];
        uVar8 = -uVar13;
        if (0 < (int)uVar13) {
          uVar8 = uVar13;
        }
        if (((long)local_48[lVar15 != 0] <= (long)((ulong)uVar8 << ((char)iVar9 + 1U & 0x3f))) &&
           (ptVar5[lVar19 + lVar15] != 0)) {
          uVar18 = (uint)uVar17;
          break;
        }
        ptVar5[lVar19 + lVar15] = 0;
        ptVar6[lVar19 + lVar15] = 0;
        bVar20 = 1 < uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar20);
    }
    x->plane[plane].eobs[block] = (uint16_t)uVar18;
    txb_ctx = local_40;
  }
  uVar13 = (uint)""[tx_size] + (uint)""[tx_size] + 1 >> 1 & 0xff;
  bVar20 = plane != 0;
  txb_costs = (x->coeff_costs).coeff_costs[uVar13] + bVar20;
  if (uVar18 == 0) {
    iVar9 = (x->coeff_costs).coeff_costs[uVar13][bVar20].txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }
  else {
    tx_class = ""[local_38];
    cVar1 = ""[tx_size];
    iVar10 = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
    iVar9 = (int)local_38;
    iVar11 = get_tx_type_cost(x,&x->e_mbd,plane,tx_size,(TX_TYPE)local_38,reduced_tx_set_used);
    iVar12 = get_eob_cost(uVar18,(x->coeff_costs).eob_costs[cVar1] + bVar20,txb_costs,tx_class);
    lVar19 = *(long *)((long)&av1_scan_orders[tx_size][0].scan + (ulong)(uint)(iVar9 << 4));
    ptVar4 = x->plane[plane].qcoeff;
    uVar2 = x->plane[plane].eobs[block];
    iVar9 = ptVar4[(long)(block << 4) + (long)*(short *)(lVar19 + -2 + (ulong)uVar2 * 2)];
    iVar14 = -iVar9;
    if (0 < iVar9) {
      iVar14 = iVar9;
    }
    iVar9 = iVar14 * 0x800 + -0x800;
    if (1 < uVar2) {
      uVar17 = (ulong)(uVar2 - 2);
      do {
        uVar18 = ptVar4[(long)(block << 4) + (long)*(short *)(lVar19 + uVar17 * 2)];
        uVar13 = -uVar18;
        if (0 < (int)uVar18) {
          uVar13 = uVar18;
        }
        uVar16 = (ulong)uVar13;
        if (0xd < uVar13) {
          uVar16 = 0xe;
        }
        iVar9 = iVar9 + costLUT[uVar16];
        bVar20 = uVar17 != 0;
        uVar17 = uVar17 - 1;
      } while (bVar20);
    }
    iVar9 = iVar11 + iVar10 + iVar12 + (uVar2 - 1) * 0x4e3 + iVar9;
  }
  return iVar9;
}

Assistant:

int av1_cost_coeffs_txb_laplacian(const MACROBLOCK *x, const int plane,
                                  const int block, const TX_SIZE tx_size,
                                  const TX_TYPE tx_type,
                                  const TXB_CTX *const txb_ctx,
                                  const int reduced_tx_set_used,
                                  const int adjust_eob) {
  const struct macroblock_plane *p = &x->plane[plane];
  int eob = p->eobs[block];

  if (adjust_eob) {
    const SCAN_ORDER *scan_order = get_scan(tx_size, tx_type);
    const int16_t *scan = scan_order->scan;
    tran_low_t *tcoeff = p->coeff + BLOCK_OFFSET(block);
    tran_low_t *qcoeff = p->qcoeff + BLOCK_OFFSET(block);
    tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);
    update_coeff_eob_fast(&eob, av1_get_tx_scale(tx_size), p->dequant_QTX, scan,
                          tcoeff, qcoeff, dqcoeff);
    p->eobs[block] = eob;
  }

  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const LV_MAP_COEFF_COST *const coeff_costs =
      &x->coeff_costs.coeff_costs[txs_ctx][plane_type];
  if (eob == 0) {
    return coeff_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }

  const MACROBLOCKD *const xd = &x->e_mbd;
  const TX_CLASS tx_class = tx_type_to_class[tx_type];

  return warehouse_efficients_txb_laplacian(
      x, plane, block, tx_size, txb_ctx, eob, plane_type, coeff_costs, xd,
      tx_type, tx_class, reduced_tx_set_used);
}